

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,duckdb::interval_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  const_reference pvVar9;
  long lVar10;
  idx_t iVar11;
  long lVar12;
  idx_t iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  idx_t iVar17;
  bool bVar18;
  idx_t entry_idx;
  uchar **rhs_locations;
  idx_t local_78;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar9;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_78 = 0;
      iVar17 = 0;
      do {
        iVar13 = iVar17;
        if (psVar6 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar6[iVar17];
        }
        iVar11 = iVar13;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar13];
        }
        lVar10 = *(long *)(pdVar4 + iVar13 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar10 + (col_idx >> 3))) != 0) {
          lVar8 = *(long *)(lVar10 + 8 + vVar5);
          lVar15 = iVar11 * 0x10;
          lVar14 = (*(long *)(lVar10 + vVar5) >> 0x20) + lVar8 / 86400000000;
          lVar12 = lVar14 % 0x1e;
          lVar16 = (long)(int)*(long *)(lVar10 + vVar5) + lVar14 / 0x1e;
          lVar14 = (long)*(int *)(pdVar3 + lVar15 + 4) +
                   *(long *)(pdVar3 + lVar15 + 8) / 86400000000;
          lVar10 = lVar14 % 0x1e;
          lVar14 = (long)*(int *)(pdVar3 + lVar15) + lVar14 / 0x1e;
          if ((lVar14 < lVar16) ||
             ((lVar14 <= lVar16 &&
              ((lVar10 < lVar12 ||
               ((lVar10 <= lVar12 &&
                (*(long *)(pdVar3 + lVar15 + 8) % 86400000000 < lVar8 % 86400000000)))))))) {
            psVar6[local_78] = (sel_t)iVar13;
            local_78 = local_78 + 1;
          }
        }
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
      return local_78;
    }
  }
  else if (count != 0) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_78 = 0;
    iVar17 = 0;
    do {
      iVar13 = iVar17;
      if (psVar6 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar6[iVar17];
      }
      iVar11 = iVar13;
      if (psVar7 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar7[iVar13];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (puVar1[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
      }
      if ((!bVar18) &&
         (lVar10 = *(long *)(pdVar4 + iVar13 * 8),
         ((uint)*(byte *)(lVar10 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) != 0)) {
        lVar8 = *(long *)(lVar10 + 8 + vVar5);
        lVar12 = iVar11 * 0x10;
        lVar14 = (*(long *)(lVar10 + vVar5) >> 0x20) + lVar8 / 86400000000;
        lVar16 = lVar14 % 0x1e;
        lVar14 = (long)(int)*(long *)(lVar10 + vVar5) + lVar14 / 0x1e;
        lVar15 = (long)*(int *)(pdVar3 + lVar12 + 4) + *(long *)(pdVar3 + lVar12 + 8) / 86400000000;
        lVar10 = lVar15 % 0x1e;
        lVar15 = (long)*(int *)(pdVar3 + lVar12) + lVar15 / 0x1e;
        if ((lVar15 < lVar14) ||
           ((lVar15 <= lVar14 &&
            ((lVar10 < lVar16 ||
             ((lVar10 <= lVar16 &&
              (*(long *)(pdVar3 + lVar12 + 8) % 86400000000 < lVar8 % 86400000000)))))))) {
          psVar6[local_78] = (sel_t)iVar13;
          local_78 = local_78 + 1;
        }
      }
      iVar17 = iVar17 + 1;
    } while (count != iVar17);
    return local_78;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}